

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<google::protobuf::Descriptor_const*const&>,std::tuple<>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
           *this,iterator iter,piecewise_construct_t *args,
          tuple<const_google::protobuf::Descriptor_*const_&> *args_1,tuple<> *args_2)

{
  bool bVar1;
  reference args_00;
  FindElement local_50;
  iterator local_48;
  iterator local_38;
  iterator local_28;
  
  local_38.field_1 = iter.field_1;
  local_38.ctrl_ = iter.ctrl_;
  construct<std::piecewise_construct_t_const&,std::tuple<google::protobuf::Descriptor_const*const&>,std::tuple<>>
            (this,local_38.field_1.slot_,args,args_1,args_2);
  local_50.s = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                *)this;
  args_00 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
            ::iterator::operator*(&local_38);
  local_28 = (iterator)
             DecomposePair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>::FindElement,std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>&>
                       (&local_50,args_00);
  local_48.ctrl_ = local_38.ctrl_;
  local_48.field_1.slot_ = (slot_type *)local_38.field_1;
  bVar1 = container_internal::operator==(&local_28,&local_48);
  if (bVar1) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xfe2,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>, Args = <const std::piecewise_construct_t &, std::tuple<const google::protobuf::Descriptor *const &>, std::tuple<>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }